

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall CVmConsole::open_command_log(CVmConsole *this,CVmNetFile *nf,int event_script)

{
  uint uVar1;
  FILE *pFVar2;
  CVmDataSource *pCVar3;
  
  close_command_log(this);
  if (nf == (CVmNetFile *)0x0) {
    uVar1 = 1;
  }
  else {
    pFVar2 = fopen(nf->lclfname,"w");
    if (pFVar2 == (FILE *)0x0) {
      CVmNetFile::abandon(nf);
    }
    else {
      this->command_nf_ = nf;
      pCVar3 = (CVmDataSource *)operator_new(0x10);
      pCVar3->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_003141a8;
      pCVar3[1]._vptr_CVmDataSource = (_func_int **)pFVar2;
      this->command_fp_ = pCVar3;
    }
    this->field_0x18 = this->field_0x18 & 0xfb | (char)event_script * '\x04' & 4U;
    if ((event_script != 0) && (pCVar3 = this->command_fp_, pCVar3 != (CVmDataSource *)0x0)) {
      (*pCVar3->_vptr_CVmDataSource[5])(pCVar3,"<eventscript>\n");
      (*this->command_fp_->_vptr_CVmDataSource[9])();
    }
    uVar1 = (uint)(this->command_fp_ == (CVmDataSource *)0x0);
  }
  return uVar1;
}

Assistant:

int CVmConsole::open_command_log(VMG_ CVmNetFile *nf, int event_script)
{
    /* close any existing command log file */
    close_command_log(vmg0_);

    /* if the network file open failed, return failure */
    if (nf == 0)
        return 1;
    
    /* open the file */
    osfildef *fp = osfopwt(nf->lclfname, OSFTCMD);
    if (fp != 0)
    {
        /* success - remember the file handle and net descriptor */
        command_nf_ = nf;
        command_fp_ = new CVmFileSource(fp);
    }
    else
    {
        /* failed - abandon the network file */
        nf->abandon(vmg0_);
    }

    /* note the type */
    command_eventscript_ = event_script;

    /* if it's an event script, write the file type tag */
    if (event_script && command_fp_ != 0)
    {
        command_fp_->writez("<eventscript>\n");
        command_fp_->flush();
    }

    /* return success if we successfully opened the file */
    return (command_fp_ == 0);
}